

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_avx2_256_16.c
# Opt level: O0

void arr_store_si256(int8_t *array,__m256i vWH,int32_t i,int32_t s1Len,int32_t j,int32_t s2Len)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  undefined8 in_XMM0_Qa;
  undefined8 in_YMM0_H;
  undefined1 local_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  
  uStack_49 = (undefined1)((ulong)in_YMM0_H >> 0x38);
  if ((((-1 < in_ESI) && (in_ESI < in_EDX)) && (-1 < in_ECX)) && (in_ECX < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)in_ESI * (long)in_R8D + (long)in_ECX) = uStack_49;
  }
  uStack_4a = (undefined1)((ulong)in_YMM0_H >> 0x30);
  if (((-1 < in_ESI + 1) && (in_ESI + 1 < in_EDX)) && ((-1 < in_ECX + -1 && (in_ECX + -1 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 1) * (long)in_R8D + (long)(in_ECX + -1)) = uStack_4a;
  }
  uStack_4b = (undefined1)((ulong)in_YMM0_H >> 0x28);
  if (((-1 < in_ESI + 2) && (in_ESI + 2 < in_EDX)) && ((-1 < in_ECX + -2 && (in_ECX + -2 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 2) * (long)in_R8D + (long)(in_ECX + -2)) = uStack_4b;
  }
  uStack_4c = (undefined1)((ulong)in_YMM0_H >> 0x20);
  if ((((-1 < in_ESI + 3) && (in_ESI + 3 < in_EDX)) && (-1 < in_ECX + -3)) && (in_ECX + -3 < in_R8D)
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 3) * (long)in_R8D + (long)(in_ECX + -3)) = uStack_4c;
  }
  uStack_4d = (undefined1)((ulong)in_YMM0_H >> 0x18);
  if (((-1 < in_ESI + 4) && (in_ESI + 4 < in_EDX)) && ((-1 < in_ECX + -4 && (in_ECX + -4 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 4) * (long)in_R8D + (long)(in_ECX + -4)) = uStack_4d;
  }
  uStack_4e = (undefined1)((ulong)in_YMM0_H >> 0x10);
  if (((-1 < in_ESI + 5) && (in_ESI + 5 < in_EDX)) && ((-1 < in_ECX + -5 && (in_ECX + -5 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 5) * (long)in_R8D + (long)(in_ECX + -5)) = uStack_4e;
  }
  uStack_4f = (undefined1)((ulong)in_YMM0_H >> 8);
  if ((((-1 < in_ESI + 6) && (in_ESI + 6 < in_EDX)) && (-1 < in_ECX + -6)) && (in_ECX + -6 < in_R8D)
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 6) * (long)in_R8D + (long)(in_ECX + -6)) = uStack_4f;
  }
  uStack_50 = (undefined1)in_YMM0_H;
  if (((-1 < in_ESI + 7) && (in_ESI + 7 < in_EDX)) && ((-1 < in_ECX + -7 && (in_ECX + -7 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 7) * (long)in_R8D + (long)(in_ECX + -7)) = uStack_50;
  }
  if (((-1 < in_ESI + 8) && (in_ESI + 8 < in_EDX)) && ((-1 < in_ECX + -8 && (in_ECX + -8 < in_R8D)))
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 8) * (long)in_R8D + (long)(in_ECX + -8)) = uStack_49;
  }
  if ((((-1 < in_ESI + 9) && (in_ESI + 9 < in_EDX)) && (-1 < in_ECX + -9)) && (in_ECX + -9 < in_R8D)
     ) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 9) * (long)in_R8D + (long)(in_ECX + -9)) = uStack_4a;
  }
  if (((-1 < in_ESI + 10) && (in_ESI + 10 < in_EDX)) &&
     ((-1 < in_ECX + -10 && (in_ECX + -10 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 10) * (long)in_R8D + (long)(in_ECX + -10)) = uStack_4b;
  }
  if (((-1 < in_ESI + 0xb) && (in_ESI + 0xb < in_EDX)) &&
     ((-1 < in_ECX + -0xb && (in_ECX + -0xb < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0xb) * (long)in_R8D + (long)(in_ECX + -0xb)) =
         uStack_4c;
  }
  if ((((-1 < in_ESI + 0xc) && (in_ESI + 0xc < in_EDX)) && (-1 < in_ECX + -0xc)) &&
     (in_ECX + -0xc < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0xc) * (long)in_R8D + (long)(in_ECX + -0xc)) =
         uStack_4d;
  }
  if (((-1 < in_ESI + 0xd) && (in_ESI + 0xd < in_EDX)) &&
     ((-1 < in_ECX + -0xd && (in_ECX + -0xd < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0xd) * (long)in_R8D + (long)(in_ECX + -0xd)) =
         uStack_4e;
  }
  if (((-1 < in_ESI + 0xe) && (in_ESI + 0xe < in_EDX)) &&
     ((-1 < in_ECX + -0xe && (in_ECX + -0xe < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0xe) * (long)in_R8D + (long)(in_ECX + -0xe)) =
         uStack_4f;
  }
  if ((((-1 < in_ESI + 0xf) && (in_ESI + 0xf < in_EDX)) && (-1 < in_ECX + -0xf)) &&
     (in_ECX + -0xf < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0xf) * (long)in_R8D + (long)(in_ECX + -0xf)) =
         uStack_50;
  }
  uStack_59 = (undefined1)((ulong)in_XMM0_Qa >> 0x38);
  if (((-1 < in_ESI + 0x10) && (in_ESI + 0x10 < in_EDX)) &&
     ((-1 < in_ECX + -0x10 && (in_ECX + -0x10 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x10) * (long)in_R8D + (long)(in_ECX + -0x10)) =
         uStack_59;
  }
  uStack_5a = (undefined1)((ulong)in_XMM0_Qa >> 0x30);
  if (((-1 < in_ESI + 0x11) && (in_ESI + 0x11 < in_EDX)) &&
     ((-1 < in_ECX + -0x11 && (in_ECX + -0x11 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x11) * (long)in_R8D + (long)(in_ECX + -0x11)) =
         uStack_5a;
  }
  uStack_5b = (undefined1)((ulong)in_XMM0_Qa >> 0x28);
  if ((((-1 < in_ESI + 0x12) && (in_ESI + 0x12 < in_EDX)) && (-1 < in_ECX + -0x12)) &&
     (in_ECX + -0x12 < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x12) * (long)in_R8D + (long)(in_ECX + -0x12)) =
         uStack_5b;
  }
  uStack_5c = (undefined1)((ulong)in_XMM0_Qa >> 0x20);
  if (((-1 < in_ESI + 0x13) && (in_ESI + 0x13 < in_EDX)) &&
     ((-1 < in_ECX + -0x13 && (in_ECX + -0x13 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x13) * (long)in_R8D + (long)(in_ECX + -0x13)) =
         uStack_5c;
  }
  uStack_5d = (undefined1)((ulong)in_XMM0_Qa >> 0x18);
  if (((-1 < in_ESI + 0x14) && (in_ESI + 0x14 < in_EDX)) &&
     ((-1 < in_ECX + -0x14 && (in_ECX + -0x14 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x14) * (long)in_R8D + (long)(in_ECX + -0x14)) =
         uStack_5d;
  }
  uStack_5e = (undefined1)((ulong)in_XMM0_Qa >> 0x10);
  if ((((-1 < in_ESI + 0x15) && (in_ESI + 0x15 < in_EDX)) && (-1 < in_ECX + -0x15)) &&
     (in_ECX + -0x15 < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x15) * (long)in_R8D + (long)(in_ECX + -0x15)) =
         uStack_5e;
  }
  uStack_5f = (undefined1)((ulong)in_XMM0_Qa >> 8);
  if (((-1 < in_ESI + 0x16) && (in_ESI + 0x16 < in_EDX)) &&
     ((-1 < in_ECX + -0x16 && (in_ECX + -0x16 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x16) * (long)in_R8D + (long)(in_ECX + -0x16)) =
         uStack_5f;
  }
  local_60 = (undefined1)in_XMM0_Qa;
  if (((-1 < in_ESI + 0x17) && (in_ESI + 0x17 < in_EDX)) &&
     ((-1 < in_ECX + -0x17 && (in_ECX + -0x17 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x17) * (long)in_R8D + (long)(in_ECX + -0x17)) =
         local_60;
  }
  if ((((-1 < in_ESI + 0x18) && (in_ESI + 0x18 < in_EDX)) && (-1 < in_ECX + -0x18)) &&
     (in_ECX + -0x18 < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x18) * (long)in_R8D + (long)(in_ECX + -0x18)) =
         uStack_59;
  }
  if (((-1 < in_ESI + 0x19) && (in_ESI + 0x19 < in_EDX)) &&
     ((-1 < in_ECX + -0x19 && (in_ECX + -0x19 < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x19) * (long)in_R8D + (long)(in_ECX + -0x19)) =
         uStack_5a;
  }
  if (((-1 < in_ESI + 0x1a) && (in_ESI + 0x1a < in_EDX)) &&
     ((-1 < in_ECX + -0x1a && (in_ECX + -0x1a < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1a) * (long)in_R8D + (long)(in_ECX + -0x1a)) =
         uStack_5b;
  }
  if ((((-1 < in_ESI + 0x1b) && (in_ESI + 0x1b < in_EDX)) && (-1 < in_ECX + -0x1b)) &&
     (in_ECX + -0x1b < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1b) * (long)in_R8D + (long)(in_ECX + -0x1b)) =
         uStack_5c;
  }
  if (((-1 < in_ESI + 0x1c) && (in_ESI + 0x1c < in_EDX)) &&
     ((-1 < in_ECX + -0x1c && (in_ECX + -0x1c < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1c) * (long)in_R8D + (long)(in_ECX + -0x1c)) =
         uStack_5d;
  }
  if (((-1 < in_ESI + 0x1d) && (in_ESI + 0x1d < in_EDX)) &&
     ((-1 < in_ECX + -0x1d && (in_ECX + -0x1d < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1d) * (long)in_R8D + (long)(in_ECX + -0x1d)) =
         uStack_5e;
  }
  if ((((-1 < in_ESI + 0x1e) && (in_ESI + 0x1e < in_EDX)) && (-1 < in_ECX + -0x1e)) &&
     (in_ECX + -0x1e < in_R8D)) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1e) * (long)in_R8D + (long)(in_ECX + -0x1e)) =
         uStack_5f;
  }
  if (((-1 < in_ESI + 0x1f) && (in_ESI + 0x1f < in_EDX)) &&
     ((-1 < in_ECX + -0x1f && (in_ECX + -0x1f < in_R8D)))) {
    *(undefined1 *)(in_RDI + (long)(in_ESI + 0x1f) * (long)in_R8D + (long)(in_ECX + -0x1f)) =
         local_60;
  }
  return;
}

Assistant:

static inline void arr_store_si256(
        int *array,
        __m256i vH,
        int32_t t,
        int32_t seglen,
        int32_t d,
        int32_t dlen)
{
    array[1LL*( 0*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH,  0);
    array[1LL*( 1*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH,  1);
    array[1LL*( 2*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH,  2);
    array[1LL*( 3*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH,  3);
    array[1LL*( 4*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH,  4);
    array[1LL*( 5*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH,  5);
    array[1LL*( 6*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH,  6);
    array[1LL*( 7*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH,  7);
    array[1LL*( 8*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH,  8);
    array[1LL*( 9*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH,  9);
    array[1LL*(10*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH, 10);
    array[1LL*(11*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH, 11);
    array[1LL*(12*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH, 12);
    array[1LL*(13*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH, 13);
    array[1LL*(14*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH, 14);
    array[1LL*(15*seglen+t)*dlen + d] = (int16_t)_mm256_extract_epi16_rpl(vH, 15);
}